

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vrle.cpp
# Opt level: O0

size_t bufferToRle(uint8_t *buffer,int size,int offsetX,int y,Span *out)

{
  uint8_t uVar1;
  short sVar2;
  uint8_t curValue;
  int i;
  int curIndex;
  uint8_t value;
  size_t count;
  Span *out_local;
  int y_local;
  int offsetX_local;
  int size_local;
  uint8_t *buffer_local;
  
  count = 0;
  value = *buffer;
  curIndex = 0;
  out_local = out;
  buffer_local = buffer;
  for (i = 0; sVar2 = (short)curIndex, i < size; i = i + 1) {
    uVar1 = *buffer_local;
    if (value != uVar1) {
      if (value != '\0') {
        out_local->y = (short)y;
        out_local->x = (short)offsetX + sVar2;
        out_local->len = (short)i - sVar2;
        out_local->coverage = value;
        out_local = out_local + 1;
        count = count + 1;
      }
      curIndex = i;
      value = uVar1;
    }
    buffer_local = buffer_local + 1;
  }
  if (value != '\0') {
    out_local->y = (short)y;
    out_local->x = (short)offsetX + sVar2;
    out_local->len = (short)size - sVar2;
    out_local->coverage = value;
    count = count + 1;
  }
  return count;
}

Assistant:

size_t bufferToRle(uint8_t *buffer, int size, int offsetX, int y,
                   VRle::Span *out)
{
    size_t count = 0;
    uint8_t value = buffer[0];
    int    curIndex = 0;

    // size = offsetX < 0 ? size + offsetX : size;
    for (int i = 0; i < size; i++) {
        uint8_t curValue = buffer[0];
        if (value != curValue) {
            if (value) {
                out->y = y;
                out->x = offsetX + curIndex;
                out->len = i - curIndex;
                out->coverage = value;
                out++;
                count++;
            }
            curIndex = i;
            value = curValue;
        }
        buffer++;
    }
    if (value) {
        out->y = y;
        out->x = offsetX + curIndex;
        out->len = size - curIndex;
        out->coverage = value;
        count++;
    }
    return count;
}